

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O2

bool __thiscall ElfRelocator::relocate(ElfRelocator *this,int64_t *memoryAddress)

{
  long lVar1;
  pointer pEVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  ElfRelocatorFile *file;
  pointer file_00;
  
  uVar4 = getCrc32((this->outputData).data_,(this->outputData).size_);
  (this->outputData).size_ = 0;
  this->dataChanged = false;
  lVar1 = *memoryAddress;
  pEVar2 = (this->files).super__Vector_base<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar6 = 0;
  for (file_00 = (this->files).
                 super__Vector_base<ElfRelocatorFile,_std::allocator<ElfRelocatorFile>_>._M_impl.
                 super__Vector_impl_data._M_start; file_00 != pEVar2; file_00 = file_00 + 1) {
    bVar3 = relocateFile(this,file_00,memoryAddress);
    bVar6 = bVar6 | !bVar3;
  }
  uVar5 = getCrc32((this->outputData).data_,(this->outputData).size_);
  if (uVar4 != uVar5) {
    this->dataChanged = true;
  }
  *memoryAddress = *memoryAddress - lVar1;
  return (bool)(~bVar6 & 1);
}

Assistant:

bool ElfRelocator::relocate(int64_t& memoryAddress)
{
	int oldCrc = getCrc32(outputData.data(),outputData.size());
	outputData.clear();
	dataChanged = false;

	bool error = false;
	int64_t start = memoryAddress;

	for (ElfRelocatorFile& file: files)
	{
		if (!relocateFile(file,memoryAddress))
			error = true;
	}
	
	int newCrc = getCrc32(outputData.data(),outputData.size());
	if (oldCrc != newCrc)
		dataChanged = true;

	memoryAddress -= start;
	return !error;
}